

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O3

void test_next_bits_iterate(void)

{
  uint64_t *puVar1;
  _Bool _Var2;
  bitset_t *bitset;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  unsigned_long a;
  size_t buffer [3];
  ulong local_50 [4];
  
  uVar9 = 0;
  bitset = bitset_create();
  do {
    uVar4 = uVar9 >> 6;
    if ((uVar4 < bitset->arraysize) || (_Var2 = bitset_grow(bitset,uVar4 + 1), _Var2)) {
      bitset->array[uVar4] = bitset->array[uVar4] | 1L << ((byte)uVar9 & 0x3f);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 100);
  uVar9 = 0x3e6;
  do {
    uVar9 = uVar9 + 2;
    uVar4 = uVar9 >> 6;
    if ((uVar4 < bitset->arraysize) || (_Var2 = bitset_grow(bitset,uVar4 + 1), _Var2)) {
      bitset->array[uVar4] = bitset->array[uVar4] | 1L << ((byte)uVar9 & 0x3e);
    }
  } while (uVar9 < 0x44a);
  uVar9 = bitset->arraysize;
  if (uVar9 == 0) {
    a = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    do {
      a = uVar5;
      puVar1 = bitset->array;
      uVar7 = (puVar1[uVar3] >> ((byte)uVar4 & 0x3f)) << ((byte)uVar4 & 0x3f);
      uVar4 = uVar4 & 0xffffffffffffffc0;
      uVar8 = 0;
      do {
        while (uVar7 == 0) {
          uVar3 = uVar3 + 1;
          if (uVar3 == uVar9) {
            if (uVar8 == 0) goto LAB_00102faa;
            goto LAB_00102f3b;
          }
          uVar4 = uVar4 + 0x40;
          uVar7 = puVar1[uVar3];
          if (2 < uVar8) goto LAB_00102f3b;
        }
        uVar6 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        local_50[uVar8 + 1] = uVar6 | uVar4;
        uVar8 = uVar8 + 1;
        uVar7 = uVar7 & uVar7 - 1;
      } while (uVar8 != 3);
      uVar8 = 3;
LAB_00102f3b:
      uVar4 = local_50[uVar8];
      uVar5 = a * 2 + 800;
      uVar6 = 0;
      do {
        uVar9 = a + uVar6;
        if (99 < a + uVar6) {
          uVar9 = uVar5;
        }
        _assert_int_equal(local_50[uVar6 + 1],uVar9,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                          ,0x33);
        uVar6 = uVar6 + 1;
        uVar5 = uVar5 + 2;
      } while (uVar8 != uVar6);
      uVar4 = uVar4 + 1;
      uVar3 = uVar4 >> 6;
      uVar9 = bitset->arraysize;
      uVar5 = a + uVar6;
    } while (uVar3 < uVar9);
    a = a + uVar6;
  }
LAB_00102faa:
  _assert_int_equal(a,0x96,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                    ,0x37);
  bitset_free(bitset);
  return;
}

Assistant:

DEFINE_TEST(test_next_bits_iterate) {
    bitset_t *b = bitset_create();
    for (int i = 0; i < 100; i++) bitset_set(b, i);
    for (int i = 1000; i < 1100; i += 2) bitset_set(b, i);

    // Use an odd, small buffer size
    size_t buffer[3];
    size_t howmany = 0;
    size_t i = 0;
    for (size_t startfrom = 0;
         (howmany = bitset_next_set_bits(
              b, buffer, sizeof(buffer) / sizeof(buffer[0]), &startfrom)) > 0;
         startfrom++) {
        for (size_t j = 0; j < howmany; j++) {
            size_t expected;
            if (i < 100) {
                expected = i;
            } else {
                expected = 1000 + 2 * (i - 100);
            }
            assert_int_equal(buffer[j], expected);
            ++i;
        }
    }
    assert_int_equal(i, 150);
    bitset_free(b);
}